

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_source_panner.cpp
# Opt level: O0

Matrix3d * __thiscall
ear::QuadRegion::_calcPolyBasis
          (Matrix3d *__return_storage_ptr__,QuadRegion *this,MatrixXd *positions)

{
  EigenBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_> *pEVar1;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *this_00;
  non_const_type local_2b8;
  type local_2b0;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_298;
  type local_280;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_258;
  type local_240;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_228;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_210;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_1f8;
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_1e0 [24];
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> local_1c8;
  DenseBase<Eigen::Matrix<double,3,3,0,3,3>> local_1a8 [8];
  Matrix3d polyBasis;
  Matrix<double,3,1,0,3,1> local_128 [8];
  Vector3d d;
  Matrix<double,3,1,0,3,1> local_d8 [8];
  Vector3d c;
  Matrix<double,3,1,0,3,1> local_88 [8];
  Vector3d b;
  Matrix<double,3,1,0,3,1> local_38 [8];
  Vector3d a;
  MatrixXd *positions_local;
  QuadRegion *this_local;
  
  pEVar1 = (EigenBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_> *)
           (b.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array +
           2);
  a.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (double)positions;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
            ((RowXpr *)pEVar1,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)positions,0);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>>(local_38,pEVar1);
  pEVar1 = (EigenBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_> *)
           (c.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array +
           2);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
            ((RowXpr *)pEVar1,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)positions,1);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>>(local_88,pEVar1);
  pEVar1 = (EigenBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_> *)
           (d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array +
           2);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
            ((RowXpr *)pEVar1,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)positions,2);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>>(local_d8,pEVar1);
  pEVar1 = (EigenBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_> *)
           (polyBasis.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array + 8);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
            ((RowXpr *)pEVar1,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)positions,3);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>>(local_128,pEVar1);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)local_1a8);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            (&local_1f8,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_88,
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_38);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            (&local_210,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_d8,
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_128);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
  ::
  cross<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((type *)local_1e0,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
              *)&local_1f8,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_210);
  Eigen::DenseBase<Eigen::Matrix<double,3,3,0,3,3>>::operator<<(&local_1c8,local_1a8,local_1e0);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            (&local_258,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_d8,
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_128);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
  cross<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            (&local_240,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_38,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_258);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            (&local_298,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_88,
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_38);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
  ::cross<Eigen::Matrix<double,3,1,0,3,1>>
            (&local_280,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
              *)&local_298,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_128);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+
            (&local_228,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_240,
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_280);
  this_00 = Eigen::CommaInitializer<Eigen::Matrix<double,3,3,0,3,3>>::operator_
                      ((CommaInitializer<Eigen::Matrix<double,3,3,0,3,3>> *)&local_1c8,
                       (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        *)&local_228);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
            (&local_2b0,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_38,
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_128);
  Eigen::CommaInitializer<Eigen::Matrix<double,3,3,0,3,3>>::operator_
            ((CommaInitializer<Eigen::Matrix<double,3,3,0,3,3>> *)this_00,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_2b0);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::~CommaInitializer(&local_1c8);
  local_2b8 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_1a8);
  Eigen::Matrix<double,3,3,0,3,3>::Matrix<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>>
            ((Matrix<double,3,3,0,3,3> *)__return_storage_ptr__,
             (EigenBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)&local_2b8);
  return __return_storage_ptr__;
}

Assistant:

Eigen::Matrix3d QuadRegion::_calcPolyBasis(Eigen::MatrixXd positions) {
    Eigen::Vector3d a = positions.row(0);
    Eigen::Vector3d b = positions.row(1);
    Eigen::Vector3d c = positions.row(2);
    Eigen::Vector3d d = positions.row(3);

    Eigen::Matrix3d polyBasis;
    polyBasis <<  //
        (b - a).cross(c - d),  //
        a.cross(c - d) + (b - a).cross(d),  //
        a.cross(d);

    return polyBasis.transpose();
  }